

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

array<float,_2>
pbrt::Checkerboard(AAMethod aaMethod,TextureEvalContext ctx,TextureMapping2DHandle *map2D,
                  TextureMapping3DHandle *map3D)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  byte bVar7;
  anon_class_24_3_48d30edf func;
  TransformMapping3D *this;
  undefined1 auVar8 [64];
  undefined1 auVar10 [64];
  array<float,_2> aVar12;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar23 [48];
  undefined1 auVar20 [64];
  undefined1 auVar22 [56];
  undefined1 auVar21 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar25 [60];
  undefined1 auVar24 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  Point3f PVar35;
  Tuple2<pbrt::Vector2,_float> local_80;
  ulong local_78;
  TextureEvalContext *local_70;
  ulong **ppuStack_68;
  Vector2f **local_60;
  Tuple2<pbrt::Vector2,_float> *local_58;
  ulong *local_50;
  TextureEvalContext local_48;
  undefined1 auVar11 [64];
  undefined1 auVar9 [64];
  array<float,_2> aVar13;
  array<float,_2> aVar14;
  array<float,_2> aVar15;
  undefined1 extraout_var [56];
  
  this = (TransformMapping3D *)
         ((map3D->super_TaggedPointer<pbrt::TransformMapping3D>).bits & 0xffffffffffff);
  if (((map2D->
       super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
       ).bits & 0xffffffffffff) == 0) {
    if (this == (TransformMapping3D *)0x0) {
      LogFatal<char_const(&)[6]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/textures.cpp"
                 ,0xd0,"Check failed: %s",(char (*) [6])0x2edeeac);
    }
    local_70 = (TextureEvalContext *)0x0;
    local_48.p.super_Tuple3<pbrt::Point3,_float> = (Tuple3<pbrt::Point3,_float>)ZEXT812(0);
    ppuStack_68 = (ulong **)((ulong)ppuStack_68 & 0xffffffff00000000);
    auVar22 = ZEXT856((ulong)ctx._8_8_);
    auVar25 = ZEXT1260(in_ZMM1._4_12_);
    PVar35 = TransformMapping3D::Map(this,ctx,(Vector3f *)&local_48,(Vector3f *)&local_70);
    auVar24._0_4_ = PVar35.super_Tuple3<pbrt::Point3,_float>.z;
    auVar24._4_60_ = auVar25;
    auVar21._0_8_ = PVar35.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar21._8_56_ = auVar22;
    auVar17 = auVar21._0_16_;
    auVar26 = vroundss_avx(auVar17,auVar17,9);
    auVar17 = vmovshdup_avx(auVar17);
    auVar17 = vroundss_avx(auVar17,auVar17,9);
    auVar30 = vroundss_avx(auVar24._0_16_,auVar24._0_16_,9);
    if (((int)auVar30._0_4_ + (int)auVar26._0_4_ + (int)auVar17._0_4_ & 1U) != 0) {
      aVar15.values[0] = 0.0;
      aVar15.values[1] = 1.0;
      return (array<float,_2>)aVar15.values;
    }
  }
  else {
    if (this != (TransformMapping3D *)0x0) {
      LogFatal<char_const(&)[7]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/textures.cpp"
                 ,0xab,"Check failed: %s",(char (*) [7])"!map3D");
    }
    local_48 = ctx;
    local_50 = &local_78;
    local_58 = &local_80;
    local_70 = &local_48;
    local_78 = 0;
    local_80.x = 0.0;
    local_80.y = 0.0;
    ppuStack_68 = &local_50;
    local_60 = (Vector2f **)&local_58;
    auVar23 = ctx._16_48_;
    func.dstdx = (Vector2f **)ppuStack_68;
    func.ctx = local_70;
    func.dstdy = local_60;
    auVar20._0_8_ =
         TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
         ::
         Dispatch<pbrt::TextureMapping2DHandle::Map(pbrt::TextureEvalContext,pbrt::Vector2<float>*,pbrt::Vector2<float>*)const::_lambda(auto:1)_1_>
                   ((TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                     *)map2D,func);
    auVar20._8_56_ = extraout_var;
    if (aaMethod != None) {
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_78;
      auVar26._8_4_ = 0x7fffffff;
      auVar26._0_8_ = 0x7fffffff7fffffff;
      auVar26._12_4_ = 0x7fffffff;
      auVar30._8_8_ = 0;
      auVar30._0_4_ = local_80.x;
      auVar30._4_4_ = local_80.y;
      auVar17 = vandps_avx(auVar17,auVar26);
      auVar26 = vandps_avx(auVar30,auVar26);
      auVar17 = vmaxps_avx(auVar26,auVar17);
      auVar19 = vsubps_avx(auVar20._0_16_,auVar17);
      fVar1 = auVar17._0_4_;
      auVar31._0_4_ = auVar20._0_4_ + fVar1;
      fVar2 = auVar17._4_4_;
      auVar31._4_4_ = auVar20._4_4_ + fVar2;
      fVar3 = auVar17._8_4_;
      auVar31._8_4_ = extraout_var._0_4_ + fVar3;
      fVar4 = auVar17._12_4_;
      auVar31._12_4_ = extraout_var._4_4_ + fVar4;
      auVar26 = vroundss_avx(auVar19,auVar19,9);
      auVar30 = vroundss_avx(auVar31,auVar31,9);
      if ((auVar26._0_4_ != auVar30._0_4_) || (NAN(auVar26._0_4_) || NAN(auVar30._0_4_))) {
LAB_0058404a:
        auVar34._8_4_ = 0x40000000;
        auVar34._0_8_ = 0x4000000040000000;
        auVar34._12_4_ = 0x40000000;
        auVar6._8_4_ = 0x3f800000;
        auVar6._0_8_ = 0x3f8000003f800000;
        auVar6._12_4_ = 0x3f800000;
        uVar5 = vcmpps_avx512vl(auVar17,auVar6,0xe);
        auVar32._0_4_ = auVar31._0_4_ * 0.5;
        auVar32._4_4_ = auVar31._4_4_ * 0.5;
        auVar32._8_4_ = auVar31._8_4_ * 0.5;
        auVar32._12_4_ = auVar31._12_4_ * 0.5;
        auVar18._0_4_ = auVar19._0_4_ * 0.5;
        auVar18._4_4_ = auVar19._4_4_ * 0.5;
        auVar18._8_4_ = auVar19._8_4_ * 0.5;
        auVar18._12_4_ = auVar19._12_4_ * 0.5;
        bVar7 = (byte)(uVar5 >> 1);
        auVar17 = vroundps_avx(auVar32,9);
        auVar27._0_4_ = (int)auVar17._0_4_;
        auVar27._4_4_ = (int)auVar17._4_4_;
        auVar27._8_4_ = (int)auVar17._8_4_;
        auVar27._12_4_ = (int)auVar17._12_4_;
        auVar17 = vcvtdq2ps_avx(auVar27);
        auVar26 = vsubps_avx(auVar32,auVar17);
        auVar33._0_4_ = auVar26._0_4_ + -0.5;
        auVar33._4_4_ = auVar26._4_4_ + -0.5;
        auVar33._8_4_ = auVar26._8_4_ + -0.5;
        auVar33._12_4_ = auVar26._12_4_ + -0.5;
        auVar26 = vmaxps_avx(ZEXT816(0) << 0x40,auVar33);
        auVar30 = vfmadd213ps_fma(auVar26,auVar34,auVar17);
        auVar17 = vroundps_avx(auVar18,9);
        auVar28._0_4_ = (int)auVar17._0_4_;
        auVar28._4_4_ = (int)auVar17._4_4_;
        auVar28._8_4_ = (int)auVar17._8_4_;
        auVar28._12_4_ = (int)auVar17._12_4_;
        auVar17 = vcvtdq2ps_avx(auVar28);
        auVar26 = vsubps_avx(auVar18,auVar17);
        auVar19._0_4_ = auVar26._0_4_ + -0.5;
        auVar19._4_4_ = auVar26._4_4_ + -0.5;
        auVar19._8_4_ = auVar26._8_4_ + -0.5;
        auVar19._12_4_ = auVar26._12_4_ + -0.5;
        auVar26 = vmaxps_avx(ZEXT816(0) << 0x40,auVar19);
        auVar17 = vfmadd213ps_fma(auVar26,auVar34,auVar17);
        auVar29._0_4_ = fVar1 + fVar1;
        auVar29._4_4_ = fVar2 + fVar2;
        auVar29._8_4_ = fVar3 + fVar3;
        auVar29._12_4_ = fVar4 + fVar4;
        auVar17 = vsubps_avx(auVar30,auVar17);
        auVar17 = vdivps_avx(auVar17,auVar29);
        auVar26 = vmovshdup_avx(auVar17);
        auVar17 = vfmadd213ss_fma(ZEXT416((uint)(auVar17._0_4_ * -2.0)),auVar26,
                                  ZEXT416((uint)(auVar17._0_4_ + auVar26._0_4_)));
        auVar9._16_48_ = auVar23;
        auVar9._0_16_ = auVar17;
        auVar8._4_60_ = auVar9._4_60_;
        auVar8._0_4_ = (uint)(bVar7 & 1) * 0x3f000000 + (uint)!(bool)(bVar7 & 1) * auVar17._0_4_;
        auVar11._0_16_ = auVar8._0_16_;
        auVar11._16_48_ = auVar23;
        auVar10._4_60_ = auVar11._4_60_;
        auVar10._0_4_ =
             (float)((uint)((byte)uVar5 & 1) * 0x3f000000 +
                    (uint)!(bool)((byte)uVar5 & 1) * auVar8._0_4_);
        auVar17 = vinsertps_avx(ZEXT416((uint)(1.0 - auVar10._0_4_)),auVar10._0_16_,0x10);
        aVar13.values[0] = SUB84(auVar17._0_8_,0);
        aVar13.values[1] = SUB84(auVar17._0_8_,4);
        return (array<float,_2>)aVar13.values;
      }
      auVar26 = vinsertps_avx(auVar31,auVar19,0x4c);
      auVar30 = vroundps_avx(auVar26,9);
      auVar26 = vmovshdup_avx(auVar30);
      if ((auVar30._0_4_ != auVar26._0_4_) || (NAN(auVar30._0_4_) || NAN(auVar26._0_4_)))
      goto LAB_0058404a;
    }
    auVar17 = vroundps_avx(auVar20._0_16_,9);
    auVar16._0_4_ = (int)auVar17._0_4_;
    auVar16._4_4_ = (int)auVar17._4_4_;
    auVar16._8_4_ = (int)auVar17._8_4_;
    auVar16._12_4_ = (int)auVar17._12_4_;
    auVar17 = vphaddd_avx(auVar16,auVar16);
    if ((auVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      aVar14.values[0] = 0.0;
      aVar14.values[1] = 1.0;
      return (array<float,_2>)aVar14.values;
    }
  }
  aVar12.values[0] = SUB84(SUB648(ZEXT464(0x3f800000),0),0);
  aVar12.values[1] = SUB84(SUB648(ZEXT464(0x3f800000),0),4);
  return (array<float,_2>)aVar12.values;
}

Assistant:

pstd::array<Float, 2> Checkerboard(AAMethod aaMethod, TextureEvalContext ctx,
                                   const TextureMapping2DHandle map2D,
                                   const TextureMapping3DHandle map3D) {
    if (map2D) {
        CHECK(!map3D);
        Vector2f dstdx, dstdy;
        Point2f st = map2D.Map(ctx, &dstdx, &dstdy);
        if (aaMethod == AAMethod::None) {
            // Point sample _Checkerboard2DTexture_
            if (((int)std::floor(st[0]) + (int)std::floor(st[1])) % 2 == 0)
                return {Float(1), Float(0)};
            return {Float(0), Float(1)};
        } else {
            // Compute closed-form box-filtered _Checkerboard2DTexture_ value

            // Evaluate single check if filter is entirely inside one of them
            Float ds = std::max(std::abs(dstdx[0]), std::abs(dstdy[0]));
            Float dt = std::max(std::abs(dstdx[1]), std::abs(dstdy[1]));
            Float s0 = st[0] - ds, s1 = st[0] + ds;
            Float t0 = st[1] - dt, t1 = st[1] + dt;
            if (std::floor(s0) == std::floor(s1) && std::floor(t0) == std::floor(t1)) {
                // Point sample _Checkerboard2DTexture_
                if (((int)std::floor(st[0]) + (int)std::floor(st[1])) % 2 == 0)
                    return {Float(1), Float(0)};
                return {Float(0), Float(1)};
            }

            // Apply box filter to checkerboard region
            auto bumpInt = [](Float x) {
                return (int)std::floor(x / 2) +
                       2 * std::max(x / 2 - (int)std::floor(x / 2) - (Float)0.5,
                                    (Float)0);
            };
            Float sint = (bumpInt(s1) - bumpInt(s0)) / (2 * ds);
            Float tint = (bumpInt(t1) - bumpInt(t0)) / (2 * dt);
            Float area2 = sint + tint - 2 * sint * tint;
            if (ds > 1 || dt > 1)
                area2 = .5f;
            return {(1 - area2), area2};
        }
    } else {
        CHECK(map3D);
        Vector3f dpdx, dpdy;
        Point3f p = map3D.Map(ctx, &dpdx, &dpdy);
        if (((int)std::floor(p.x) + (int)std::floor(p.y) + (int)std::floor(p.z)) % 2 == 0)
            return {Float(1), Float(0)};
        return {Float(0), Float(1)};
    }
}